

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

void __thiscall
cmFindProgramCommand::cmFindProgramCommand(cmFindProgramCommand *this,cmExecutionStatus *status)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  string_view local_90;
  allocator<char> local_79;
  string local_78;
  cmValue local_58;
  allocator<char> local_39;
  string local_38;
  cmExecutionStatus *local_18;
  cmExecutionStatus *status_local;
  cmFindProgramCommand *this_local;
  
  local_18 = status;
  status_local = (cmExecutionStatus *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"find_program",&local_39);
  cmFindBase::cmFindBase(&this->super_cmFindBase,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_cmFindBase)._vptr_cmFindBase = (_func_int **)&PTR__cmFindProgramCommand_01495f60;
  (this->super_cmFindBase).NamesPerDirAllowed = true;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).VariableDocumentation,"Path to a program.");
  (this->super_cmFindBase).VariableType = FILEPATH;
  PVar2 = cmMakefile::GetPolicyStatus
                    ((this->super_cmFindBase).super_cmFindCommon.Makefile,CMP0134,false);
  if (PVar2 == NEW) {
    (this->super_cmFindBase).super_cmFindCommon.RegistryView = Both;
  }
  else {
    this_00 = (this->super_cmFindBase).super_cmFindCommon.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_SIZEOF_VOID_P",&local_79);
    local_58 = cmMakefile::GetDefinition(this_00,&local_78);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"8");
    bVar1 = ::operator==(local_58,local_90);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    if (bVar1) {
      (this->super_cmFindBase).super_cmFindCommon.RegistryView = Reg64_32;
    }
    else {
      (this->super_cmFindBase).super_cmFindCommon.RegistryView = Reg32_64;
    }
  }
  return;
}

Assistant:

cmFindProgramCommand::cmFindProgramCommand(cmExecutionStatus& status)
  : cmFindBase("find_program", status)
{
  this->NamesPerDirAllowed = true;
  this->VariableDocumentation = "Path to a program.";
  this->VariableType = cmStateEnums::FILEPATH;
  // Windows Registry views
  // When policy CMP0134 is not NEW, rely on previous behavior:
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0134) !=
      cmPolicies::NEW) {
    if (this->Makefile->GetDefinition("CMAKE_SIZEOF_VOID_P") == "8") {
      this->RegistryView = cmWindowsRegistry::View::Reg64_32;
    } else {
      this->RegistryView = cmWindowsRegistry::View::Reg32_64;
    }
  } else {
    this->RegistryView = cmWindowsRegistry::View::Both;
  }
}